

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PluralFormat::format
          (UnicodeString *__return_storage_ptr__,PluralFormat *this,double number,UErrorCode *status
          )

{
  UnicodeString *that;
  Formattable local_100;
  undefined1 local_80 [8];
  UnicodeString result;
  FieldPosition fpos;
  UErrorCode *status_local;
  double number_local;
  PluralFormat *this_local;
  
  FieldPosition::FieldPosition((FieldPosition *)((long)&result.fUnion + 0x30),-1);
  UnicodeString::UnicodeString((UnicodeString *)local_80);
  Formattable::Formattable(&local_100,number);
  that = format(this,&local_100,number,(UnicodeString *)local_80,
                (FieldPosition *)((long)&result.fUnion + 0x30),status);
  UnicodeString::UnicodeString(__return_storage_ptr__,that);
  Formattable::~Formattable(&local_100);
  UnicodeString::~UnicodeString((UnicodeString *)local_80);
  FieldPosition::~FieldPosition((FieldPosition *)((long)&result.fUnion + 0x30));
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralFormat::format(double number, UErrorCode& status) const {
    FieldPosition fpos(FieldPosition::DONT_CARE);
    UnicodeString result;
    return format(Formattable(number), number, result, fpos, status);
}